

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tar.c
# Opt level: O2

void verifyxL(archive_entry *ae)

{
  mode_t mVar1;
  la_int64_t lVar2;
  char *pcVar3;
  time_t v1;
  
  mVar1 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'ƒ',(ulong)mVar1,"archive_entry_filetype(ae)",0xa000,"AE_IFLNK",(void *)0x0
                     );
  mVar1 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'Ɠ',(ulong)(mVar1 & 0x1ff),"archive_entry_mode(ae) & 0777",0x1ed,"0755",
                      (void *)0x0);
  lVar2 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'Ɣ',lVar2,"archive_entry_uid(ae)",1000,"1000",(void *)0x0);
  lVar2 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'ƕ',lVar2,"archive_entry_gid(ae)",1000,"1000",(void *)0x0);
  pcVar3 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
             ,L'Ɩ',pcVar3,"archive_entry_uname(ae)","tim","\"tim\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
             ,L'Ɨ',pcVar3,"archive_entry_gname(ae)","tim","\"tim\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
             ,L'Ƙ',pcVar3,"archive_entry_pathname(ae)","symlink","\"symlink\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_symlink(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
             ,L'ơ',pcVar3,"archive_entry_symlink(ae)",
             "this_is_a_very_long_symlink_body_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz"
             ,
             "\"this_is_a_very_long_symlink_body_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_\" \"abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz\""
             ,(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                   ,L'Ƣ',(uint)(pcVar3 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  v1 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'ƣ',v1,"archive_entry_mtime(ae)",0x46985df8,"1184390648",(void *)0x0);
  return;
}

Assistant:

static void verifyxL(struct archive_entry *ae)
{
	assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
	assertEqualInt(archive_entry_mode(ae) & 0777, 0755);
	assertEqualInt(archive_entry_uid(ae), 1000);
	assertEqualInt(archive_entry_gid(ae), 1000);
	assertEqualString(archive_entry_uname(ae), "tim");
	assertEqualString(archive_entry_gname(ae), "tim");
	assertEqualString(archive_entry_pathname(ae), "symlink");
	assertEqualString(archive_entry_symlink(ae),
	    "this_is_a_very_long_symlink_body_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz_"
	    "abcdefghijklmnopqrstuvwxyz_abcdefghijklmnopqrstuvwxyz");
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(archive_entry_mtime(ae), 1184390648);
}